

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io-window.cc
# Opt level: O1

void __thiscall Debugger::IOWindow::Tick(IOWindow *this)

{
  Emulator *pEVar1;
  Debugger *pDVar2;
  BitArg args;
  BitArg args_00;
  BitArg args_1;
  BitArg args_1_00;
  BitArg args_2;
  BitArg args_2_00;
  BitArg arg;
  BitArg arg_00;
  BitArg args_3;
  BitArg args_3_00;
  BitArg args_01;
  BitArg args_02;
  BitArg args_4;
  BitArg args_4_00;
  BitArg args_1_01;
  BitArg args_1_02;
  BitArg args_5;
  BitArg args_5_00;
  BitArg args_2_01;
  BitArg args_2_02;
  BitArg args_6;
  BitArg args_6_00;
  BitArg arg_01;
  BitArg arg_02;
  BitArg args_3_01;
  BitArg arg_03;
  BitArg args_03;
  BitArg args_04;
  BitArg args_3_02;
  BitArg args_7;
  undefined1 auVar3 [32];
  BitArg args_7_00;
  BitArg args_05;
  BitArg args_06;
  CgbSwatchArg args_2_03;
  CgbSwatchArg args_2_04;
  CgbSwatchArg args_2_05;
  CgbSwatchArg args_2_06;
  CgbSwatchArg args_2_07;
  CgbSwatchArg args_2_08;
  CgbSwatchArg args_2_09;
  CgbSwatchArg args_2_10;
  CgbSwatchArg args_2_11;
  CgbSwatchArg args_2_12;
  CgbSwatchArg args_2_13;
  CgbSwatchArg args_2_14;
  CgbSwatchArg args_2_15;
  CgbSwatchArg args_2_16;
  CgbSwatchArg args_2_17;
  CgbSwatchArg args_3_03;
  CgbSwatchArg args_3_04;
  CgbSwatchArg args_3_05;
  CgbSwatchArg args_3_06;
  CgbSwatchArg args_3_07;
  CgbSwatchArg args_3_08;
  CgbSwatchArg args_3_09;
  CgbSwatchArg args_3_10;
  CgbSwatchArg args_3_11;
  CgbSwatchArg args_3_12;
  CgbSwatchArg args_3_13;
  CgbSwatchArg args_3_14;
  CgbSwatchArg args_3_15;
  CgbSwatchArg args_3_16;
  CgbSwatchArg args_3_17;
  bool bVar4;
  byte bVar5;
  u8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *pcVar9;
  IntArg args_07;
  IntArg args_08;
  IntArg args_09;
  IntArg args_1_03;
  IntArg args_1_04;
  CgbSwatchArg args_10;
  CgbSwatchArg args_11;
  CgbSwatchArg args_12;
  CgbSwatchArg args_1_05;
  CgbSwatchArg args_1_06;
  CgbSwatchArg args_1_07;
  CgbSwatchArg args_1_08;
  CgbSwatchArg args_1_09;
  CgbSwatchArg args_1_10;
  CgbSwatchArg args_1_11;
  CgbSwatchArg args_1_12;
  CgbSwatchArg args_1_13;
  CgbSwatchArg args_1_14;
  CgbSwatchArg args_1_15;
  CgbSwatchArg args_1_16;
  CgbSwatchArg args_1_17;
  CgbSwatchArg args_1_18;
  CgbSwatchArg args_1_19;
  undefined4 uVar10;
  ImVec4 kRegColor;
  uint7 uStack_5df;
  char local_5d8;
  undefined7 uStack_5d7;
  char *pcStack_5d0;
  char *local_5c8;
  undefined8 uStack_5c0;
  undefined1 local_5b8;
  undefined7 uStack_5b7;
  undefined1 local_5b0;
  undefined7 uStack_5af;
  char *pcStack_5a8;
  char *local_5a0;
  undefined8 uStack_598;
  undefined1 local_590;
  undefined7 uStack_58f;
  SgbSwatchArg local_588;
  SgbSwatchArg local_580;
  SgbSwatchArg local_578;
  undefined8 local_570;
  undefined4 local_568;
  undefined8 local_560;
  undefined4 local_558;
  undefined8 local_550;
  undefined4 local_548;
  undefined8 local_540;
  undefined4 local_538;
  SgbSwatchArg local_530;
  undefined4 local_528;
  SgbSwatchArg local_520;
  undefined4 local_518;
  SgbSwatchArg local_510;
  undefined4 local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  undefined8 local_4f0;
  undefined4 local_4e8;
  undefined8 local_4e0;
  undefined4 local_4d8;
  undefined8 local_4d0;
  undefined4 local_4c8;
  undefined8 local_4c0;
  undefined4 local_4b8;
  undefined8 local_4b0;
  undefined4 local_4a8;
  undefined8 local_4a0;
  undefined4 local_498;
  undefined8 local_490;
  undefined4 local_488;
  undefined8 local_480;
  undefined4 local_478;
  char buf [10];
  float fStack_464;
  uint7 uStack_44f;
  ImVec4 kRegColor_3;
  uint7 uStack_427;
  undefined7 uStack_31f;
  uint7 uStack_2ff;
  undefined7 uStack_2f7;
  uint7 uStack_2d7;
  undefined7 uStack_2cf;
  undefined7 uStack_2af;
  undefined7 uStack_2a7;
  uint7 uStack_287;
  undefined7 uStack_27f;
  uint7 uStack_25f;
  undefined7 uStack_257;
  uint7 uStack_237;
  undefined7 uStack_22f;
  uint7 uStack_20f;
  undefined7 uStack_207;
  uint7 uStack_1e7;
  undefined7 uStack_1df;
  uint7 uStack_1bf;
  undefined7 uStack_1b7;
  uint7 uStack_197;
  undefined7 uStack_18f;
  undefined7 uStack_16f;
  undefined7 uStack_167;
  undefined7 uStack_147;
  undefined7 uStack_13f;
  undefined7 uStack_11f;
  undefined7 uStack_117;
  undefined7 uStack_f7;
  undefined7 uStack_ef;
  undefined7 uStack_cf;
  undefined7 uStack_c7;
  undefined7 uStack_a7;
  undefined7 uStack_9f;
  undefined7 uStack_7f;
  undefined7 uStack_77;
  undefined7 uStack_57;
  char local_4a [10];
  ImVec4 kRegColor_1;
  
  if ((this->super_Window).is_open == true) {
    bVar4 = ImGui::Begin("IO",&(this->super_Window).is_open,0);
    if (bVar4) {
      args_6._33_7_ = uStack_147;
      args_6.invert = true;
      args_6._1_7_ = uStack_167;
      args_6.mask = 0x22;
      args_5._33_7_ = uStack_11f;
      args_5.invert = true;
      args_5._1_7_ = uStack_13f;
      args_5.mask = 0x24;
      args_4._33_7_ = uStack_f7;
      args_4.invert = true;
      args_4._1_7_ = uStack_117;
      args_4.mask = 0x28;
      args_3._33_7_ = uStack_cf;
      args_3.invert = true;
      args_3._1_7_ = uStack_ef;
      args_3.mask = 0x11;
      args_2._33_7_ = uStack_a7;
      args_2.invert = true;
      args_2._1_7_ = uStack_c7;
      args_2.mask = 0x12;
      args_1._33_7_ = uStack_7f;
      args_1.invert = true;
      args_1._1_7_ = uStack_9f;
      args_1.mask = 0x14;
      args._33_7_ = uStack_57;
      args.invert = true;
      args._1_7_ = uStack_77;
      args.mask = 0x18;
      args.true_text = "D";
      args.false_text = "_";
      args.tooltip = (char *)0x0;
      args_1.true_text = "U";
      args_1.false_text = "_";
      args_1.tooltip = (char *)0x0;
      args_2.true_text = "L";
      args_2.false_text = "_";
      args_2.tooltip = (char *)0x0;
      args_3.true_text = "R";
      args_3.false_text = "_";
      args_3.tooltip = (char *)0x0;
      args_4.true_text = "+";
      args_4.false_text = "_";
      args_4.tooltip = (char *)0x0;
      args_5.true_text = "-";
      args_5.false_text = "_";
      args_5.tooltip = (char *)0x0;
      args_6.true_text = "B";
      args_6.false_text = "_";
      args_6.tooltip = (char *)0x0;
      auVar3 = ZEXT2032(CONCAT416(0x1c8eec,CONCAT88("A",CONCAT71(uStack_18f,0x21))));
      args_7._32_4_ = (int)CONCAT71(uStack_16f,1);
      args_7.mask = auVar3[0];
      args_7._1_7_ = auVar3._1_7_;
      args_7.true_text = (char *)auVar3._8_8_;
      args_7.false_text = (char *)auVar3._16_8_;
      args_7.tooltip = (char *)auVar3._24_8_;
      args_7._36_4_ = (int)((uint7)uStack_16f >> 0x18);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (((this->super_Window).d)->e,0xff00,"JOYP",args,args_1,args_2,args_3,args_4,args_5,
                 args_6,args_7);
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff01,"SB");
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff02,"SC");
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff04,"DIV");
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff05,"TIMA");
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff06,"TMA");
      pEVar1 = ((this->super_Window).d)->e;
      kRegColor.x = 1.0;
      kRegColor.y = 0.75;
      kRegColor.z = 0.3;
      kRegColor.w = 1.0;
      snprintf(buf,10,"[%s]","TAC");
      bVar5 = emulator_read_u8_raw(pEVar1,0xff07);
      ImGui::Text("0x%04X%8s:",0xff07,buf);
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextColored(&kRegColor,"%02X ",(ulong)bVar5);
      pcVar8 = "on";
      if ((bVar5 & 4) == 0) {
        pcVar8 = "off";
      }
      if (*pcVar8 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar8);
      }
      ImGui::SameLine(0.0,-1.0);
      ImGui::Text("%s ",&DAT_001c8c64 + *(int *)(&DAT_001c8c64 + (ulong)(bVar5 & 3) * 4));
      pEVar1 = ((this->super_Window).d)->e;
      kRegColor.x = (float)CONCAT31(kRegColor.x._1_3_,1);
      kRegColor._8_8_ = anon_var_dwarf_b3cbe;
      buf[0] = '\x02';
      stack0xfffffffffffffb98 = "STAT ";
      kRegColor_3.x = (float)CONCAT31(kRegColor_3.x._1_3_,4);
      kRegColor_3._8_8_ = anon_var_dwarf_b3c9e;
      local_5d8 = '\b';
      pcStack_5d0 = "SERIAL ";
      local_5c8 = "";
      uStack_5c0 = 0;
      local_5b8 = 0;
      local_5b0 = 0x10;
      pcStack_5a8 = "JOYP ";
      local_5a0 = "";
      uStack_598 = 0;
      local_590 = 0;
      kRegColor_1.x = 1.0;
      kRegColor_1.y = 0.75;
      kRegColor_1.z = 0.3;
      kRegColor_1.w = 1.0;
      snprintf(local_4a,10,"[%s]","IF");
      bVar5 = emulator_read_u8_raw(pEVar1,0xff0f);
      ImGui::Text("0x%04X%8s:",0xff0f,local_4a);
      ImGui::SameLine(0.0,-1.0);
      uVar6 = 0xf9;
      ImGui::TextColored(&kRegColor_1,"%02X ",(ulong)bVar5);
      args_3_01._4_4_ = kRegColor.y;
      args_3_01._0_4_ = kRegColor.x;
      args_2_01._4_1_ = buf[4];
      args_2_01._5_1_ = buf[5];
      args_2_01._6_1_ = buf[6];
      args_2_01._7_1_ = buf[7];
      args_2_01.mask = buf[0];
      args_2_01._1_1_ = buf[1];
      args_2_01._2_1_ = buf[2];
      args_2_01._3_1_ = buf[3];
      args_1_01._4_4_ = kRegColor_3.y;
      args_1_01._0_4_ = kRegColor_3.x;
      args_01._33_7_ = uStack_5b7;
      args_01.invert = (bool)local_5b8;
      args_01._1_7_ = uStack_5d7;
      args_01.mask = local_5d8;
      arg._33_7_ = uStack_58f;
      arg.invert = (bool)local_590;
      arg._1_7_ = uStack_5af;
      arg.mask = local_5b0;
      arg.true_text = pcStack_5a8;
      arg.false_text = local_5a0;
      arg.tooltip = (char *)uStack_598;
      args_01.true_text = pcStack_5d0;
      args_01.false_text = local_5c8;
      args_01.tooltip = (char *)uStack_5c0;
      args_1_01.true_text = (char *)kRegColor_3._8_8_;
      args_1_01.false_text = "";
      args_1_01.tooltip = (char *)0x0;
      args_1_01._32_8_ = (ulong)uStack_427 << 8;
      args_2_01.true_text = stack0xfffffffffffffb98;
      args_2_01.false_text = "";
      args_2_01.tooltip = (char *)0x0;
      args_2_01._32_8_ = (ulong)uStack_44f << 8;
      args_3_01.true_text = (char *)kRegColor._8_8_;
      args_3_01.false_text = "";
      args_3_01.tooltip = (char *)0x0;
      args_3_01._32_8_ = (ulong)uStack_5df << 8;
      (anonymous_namespace)::
      TextRegBits<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                ((Emulator *)(ulong)bVar5,uVar6,arg,args_01,args_1_01,args_2_01,args_3_01);
      args_7_00._1_7_ = uStack_2cf;
      args_7_00.mask = 1;
      args_6_00._1_7_ = uStack_2a7;
      args_6_00.mask = 2;
      args_5_00._1_7_ = uStack_27f;
      args_5_00.mask = 4;
      args_4_00._1_7_ = uStack_257;
      args_4_00.mask = 8;
      args_3_00._1_7_ = uStack_22f;
      args_3_00.mask = 0x10;
      args_2_00._1_7_ = uStack_207;
      args_2_00.mask = 0x20;
      args_1_00._1_7_ = uStack_1df;
      args_1_00.mask = 0x40;
      args_00._1_7_ = uStack_1b7;
      args_00.mask = 0x80;
      args_00.true_text = "D ";
      args_00.false_text = "__";
      args_00.tooltip = "Display";
      args_00._32_8_ = (ulong)uStack_197 << 8;
      args_1_00.true_text = "WM";
      args_1_00.false_text = "__";
      args_1_00.tooltip = "Window tile map select";
      args_1_00._32_8_ = (ulong)uStack_1bf << 8;
      args_2_00.true_text = "Wd";
      args_2_00.false_text = "__";
      args_2_00.tooltip = "Window display";
      args_2_00._32_8_ = (ulong)uStack_1e7 << 8;
      args_3_00.true_text = "BD";
      args_3_00.false_text = "__";
      args_3_00.tooltip = "BG tile data select";
      args_3_00._32_8_ = (ulong)uStack_20f << 8;
      args_4_00.true_text = "BM";
      args_4_00.false_text = "__";
      args_4_00.tooltip = "BG tile map select";
      args_4_00._32_8_ = (ulong)uStack_237 << 8;
      args_5_00.true_text = "Os";
      args_5_00.false_text = "__";
      args_5_00.tooltip = "Obj size";
      args_5_00._32_8_ = (ulong)uStack_25f << 8;
      args_6_00.true_text = "Od";
      args_6_00.false_text = "__";
      args_6_00.tooltip = "Obj display";
      args_6_00._32_8_ = (ulong)uStack_287 << 8;
      args_7_00.true_text = "Bd";
      args_7_00.false_text._0_4_ = 0x1c8eeb;
      args_7_00.false_text._4_4_ = 0;
      args_7_00.tooltip = "BG display";
      args_7_00._32_4_ = (int)uStack_2af << 8;
      args_7_00._36_4_ = (int)((uint7)uStack_2af >> 0x18);
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                (((this->super_Window).d)->e,0xff40,"LCDC",args_00,args_1_00,args_2_00,args_3_00,
                 args_4_00,args_5_00,args_6_00,args_7_00);
      pEVar1 = ((this->super_Window).d)->e;
      kRegColor.x = (float)CONCAT31(kRegColor.x._1_3_,4);
      kRegColor._8_8_ = anon_var_dwarf_b3e2c;
      buf[0] = '\0';
      buf[1] = '\0';
      buf[2] = -0x80;
      buf[3] = '?';
      buf[4] = '\0';
      buf[5] = '\0';
      buf[6] = '@';
      buf[7] = '?';
      stack0xfffffffffffffb98 = 0.3;
      fStack_464 = 1.0;
      pcVar8 = "STAT";
      snprintf((char *)&kRegColor_3,10,"[%s]");
      bVar5 = emulator_read_u8_raw(pEVar1,0xff41);
      ImGui::Text("0x%04X%8s:",0xff41,&kRegColor_3);
      ImGui::SameLine(0.0,-1.0);
      ImGui::TextColored((ImVec4 *)buf,"%02X ",(ulong)(uint)bVar5);
      pcVar9 = "Yi";
      if ((bVar5 & 0x40) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar4 = ImGui::IsItemHovered(0);
        if (bVar4) {
          ImGui::SetTooltip("Y compare interrupt");
        }
      }
      pcVar9 = "2i";
      if ((bVar5 & 0x20) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar4 = ImGui::IsItemHovered(0);
        if (bVar4) {
          ImGui::SetTooltip("Mode 2 interrupt");
        }
      }
      pcVar9 = "Vi";
      if ((bVar5 & 0x10) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar4 = ImGui::IsItemHovered(0);
        if (bVar4) {
          ImGui::SetTooltip("Vblank interrupt");
        }
      }
      pcVar9 = "Hi";
      if ((bVar5 & 8) == 0) {
        pcVar9 = "__";
      }
      if (*pcVar9 != '\0') {
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s",pcVar9);
        bVar4 = ImGui::IsItemHovered(0);
        if (bVar4) {
          ImGui::SetTooltip("Hblank interrupt");
        }
      }
      arg_03._4_4_ = kRegColor.y;
      arg_03._0_4_ = kRegColor.x;
      arg_03.true_text = (char *)kRegColor._8_8_;
      arg_03.false_text = "__";
      arg_03.tooltip._0_4_ = 0x1c8d80;
      arg_03.tooltip._4_4_ = 0;
      arg_03._32_8_ = (ulong)uStack_5df << 8;
      args_07._8_8_ = pcVar8;
      args_07.text = (char *)0x3;
      anon_unknown.dwarf_b4179::TextRegBits<(anonymous_namespace)::IntArg>
                ((Emulator *)(ulong)(uint)bVar5,0x8e,arg_03,args_07);
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff42,"SCY");
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff43,"SCX");
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff44,"LY");
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff45,"LYC");
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff47,"BGP",(DmgSwatchArg)0x0,
                 (DmgSwatchArg)0x100000000,(DmgSwatchArg)0x200000000,(DmgSwatchArg)0x300000000);
      local_588.palette_index = 1;
      local_588.color_index = 1;
      local_580.palette_index = 1;
      local_580.color_index = 2;
      local_578.palette_index = 1;
      local_578.color_index = 3;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff48,"OPB0",(DmgSwatchArg)0x1,
                 (DmgSwatchArg)0x100000001,(DmgSwatchArg)0x200000001,(DmgSwatchArg)0x300000001);
      uVar7 = 0x200000002;
      (anonymous_namespace)::
      TextReg<(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg,(anonymous_namespace)::DmgSwatchArg>
                (((this->super_Window).d)->e,0xff49,"OPB1",(DmgSwatchArg)0x2,
                 (DmgSwatchArg)0x100000002,(DmgSwatchArg)0x200000002,(DmgSwatchArg)0x300000002);
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff4a,"WY");
      anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff4b,"WX");
      pDVar2 = (this->super_Window).d;
      if (pDVar2->is_cgb == true) {
        pEVar1 = pDVar2->e;
        kRegColor.x = (float)CONCAT31(kRegColor.x._1_3_,1);
        kRegColor._8_8_ = anon_var_dwarf_b3ed3;
        buf[0] = -0x80;
        stack0xfffffffffffffb98 = "Sp";
        kRegColor_3.x = 1.0;
        kRegColor_3.y = 0.75;
        kRegColor_3.z = 0.3;
        kRegColor_3.w = 1.0;
        snprintf(&local_5d8,10,"[%s]","KEY1");
        bVar5 = emulator_read_u8_raw(pEVar1,0xff4d);
        ImGui::Text("0x%04X%8s:",0xff4d,&local_5d8);
        ImGui::SameLine(0.0,-1.0);
        uVar6 = 0xf9;
        ImGui::TextColored(&kRegColor_3,"%02X ",(ulong)bVar5);
        uVar10 = (undefined4)(uStack_5df >> 0x18);
        args_05._4_4_ = kRegColor.y;
        args_05._0_4_ = kRegColor.x;
        arg_01._4_1_ = buf[4];
        arg_01._5_1_ = buf[5];
        arg_01._6_1_ = buf[6];
        arg_01._7_1_ = buf[7];
        arg_01.mask = buf[0];
        arg_01._1_1_ = buf[1];
        arg_01._2_1_ = buf[2];
        arg_01._3_1_ = buf[3];
        arg_01.true_text = stack0xfffffffffffffb98;
        arg_01.false_text = "_";
        arg_01.tooltip = "Current speed";
        arg_01._32_8_ = (ulong)uStack_44f << 8;
        args_05.true_text = (char *)kRegColor._8_8_;
        args_05.false_text._0_4_ = 0x1c8eec;
        args_05.false_text._4_4_ = 0;
        args_05.tooltip = "Speed switch";
        args_05._32_4_ = (int)uStack_5df << 8;
        args_05._36_4_ = uVar10;
        anon_unknown.dwarf_b4179::TextRegBits<(anonymous_namespace)::BitArg>
                  ((Emulator *)(ulong)bVar5,uVar6,arg_01,args_05);
        args_08.mask = (char)uVar7;
        args_08._9_3_ = (int3)((ulong)uVar7 >> 8);
        args_08.shift = (int)((ulong)uVar7 >> 0x20);
        args_08.text = (char *)0x1;
        anon_unknown.dwarf_b4179::TextReg<(anonymous_namespace)::IntArg>
                  ((anon_unknown_dwarf_b4179 *)((this->super_Window).d)->e,(Emulator *)0xff4f,0x4c96
                   ,"Bank",args_08);
        pEVar1 = ((this->super_Window).d)->e;
        kRegColor.x = 1.0;
        kRegColor.y = 0.75;
        kRegColor.z = 0.3;
        kRegColor.w = 1.0;
        snprintf(buf,10,"[%s]","HDMA5");
        bVar5 = emulator_read_u8_raw(pEVar1,0xff55);
        ImGui::Text("0x%04X%8s:",0xff55,buf);
        ImGui::SameLine(0.0,-1.0);
        ImGui::TextColored(&kRegColor,"%02X ",(ulong)bVar5);
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s:%d ","Mode",(ulong)(bVar5 >> 7));
        ImGui::SameLine(0.0,-1.0);
        ImGui::Text("%s:%d ","Blocks",(ulong)(bVar5 & 0x7f));
        pEVar1 = ((this->super_Window).d)->e;
        kRegColor.x = (float)CONCAT31(kRegColor.x._1_3_,1);
        kRegColor._8_8_ = (long)"##W" + 2;
        buf[0] = '\x02';
        stack0xfffffffffffffb98 = "R";
        kRegColor_3.x = 1.0;
        kRegColor_3.y = 0.75;
        kRegColor_3.z = 0.3;
        kRegColor_3.w = 1.0;
        snprintf(&local_5d8,10,"[%s]","RP");
        bVar5 = emulator_read_u8_raw(pEVar1,0xff56);
        ImGui::Text("0x%04X%8s:",0xff56,&local_5d8);
        ImGui::SameLine(0.0,-1.0);
        ImGui::TextColored(&kRegColor_3,"%02X ",(Emulator *)(ulong)bVar5);
        ImGui::SameLine(0.0,-1.0);
        uVar6 = 0xca;
        ImGui::Text("%s:%d ","Enable",(ulong)(bVar5 >> 6));
        args_06._4_4_ = kRegColor.y;
        args_06._0_4_ = kRegColor.x;
        arg_02._4_1_ = buf[4];
        arg_02._5_1_ = buf[5];
        arg_02._6_1_ = buf[6];
        arg_02._7_1_ = buf[7];
        arg_02.mask = buf[0];
        arg_02._1_1_ = buf[1];
        arg_02._2_1_ = buf[2];
        arg_02._3_1_ = buf[3];
        arg_02.true_text = stack0xfffffffffffffb98;
        arg_02.false_text = "_";
        arg_02.tooltip = "Read";
        arg_02._32_8_ = (ulong)uStack_44f << 8;
        args_06.true_text = (char *)kRegColor._8_8_;
        args_06.false_text._0_4_ = 0x1c8eec;
        args_06.false_text._4_4_ = 0;
        args_06.tooltip = "Write";
        args_06._32_4_ = (int)uStack_5df << 8;
        args_06._36_4_ = uVar10;
        anon_unknown.dwarf_b4179::TextRegBits<(anonymous_namespace)::BitArg>
                  ((Emulator *)(ulong)bVar5,uVar6,arg_02,args_06);
        args_03._1_7_ = uStack_2f7;
        args_03.mask = 0x80;
        args_03.true_text = "+";
        args_03.false_text = "_";
        args_03.tooltip._0_4_ = 0x1c8ddc;
        args_03.tooltip._4_4_ = 0;
        args_03._32_8_ = (ulong)uStack_2d7 << 8;
        args_1_03.mask = '?';
        args_1_03._9_3_ = 0;
        args_1_03.shift = 0;
        args_1_03.text = "Index";
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                  (((this->super_Window).d)->e,0xff68,"BCPS",args_03,args_1_03);
        anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff69,"BCPD");
        args_04._1_7_ = uStack_31f;
        args_04.mask = 0x80;
        args_04.true_text = "+";
        args_04.false_text = "_";
        args_04.tooltip._0_4_ = 0x1c8ddc;
        args_04.tooltip._4_4_ = 0;
        args_04._32_8_ = (ulong)uStack_2ff << 8;
        args_1_04.mask = '?';
        args_1_04._9_3_ = 0;
        args_1_04.shift = 0;
        args_1_04.text = "Index";
        (anonymous_namespace)::TextReg<(anonymous_namespace)::BitArg,(anonymous_namespace)::IntArg>
                  (((this->super_Window).d)->e,0xff6a,"OCPS",args_04,args_1_04);
        anon_unknown.dwarf_b4179::TextReg<>(((this->super_Window).d)->e,0xff6b,"OCPD");
        args_09.mask = (char)uVar7;
        args_09._9_3_ = (int3)((ulong)uVar7 >> 8);
        args_09.shift = (int)((ulong)uVar7 >> 0x20);
        args_09.text = (char *)0x7;
        anon_unknown.dwarf_b4179::TextReg<(anonymous_namespace)::IntArg>
                  ((anon_unknown_dwarf_b4179 *)((this->super_Window).d)->e,(Emulator *)0xff70,0x4c95
                   ,"Bank",args_09);
      }
      pEVar1 = ((this->super_Window).d)->e;
      kRegColor.x = (float)CONCAT31(kRegColor.x._1_3_,1);
      kRegColor._8_8_ = anon_var_dwarf_b3cbe;
      buf[0] = '\x02';
      stack0xfffffffffffffb98 = "STAT ";
      kRegColor_3.x = (float)CONCAT31(kRegColor_3.x._1_3_,4);
      kRegColor_3._8_8_ = anon_var_dwarf_b3c9e;
      local_5d8 = '\b';
      pcStack_5d0 = "SERIAL ";
      local_5c8 = "";
      uStack_5c0 = 0;
      local_5b8 = 0;
      local_5b0 = 0x10;
      pcStack_5a8 = "JOYP ";
      local_5a0 = "";
      uStack_598 = 0;
      local_590 = 0;
      kRegColor_1.x = 1.0;
      kRegColor_1.y = 0.75;
      kRegColor_1.z = 0.3;
      kRegColor_1.w = 1.0;
      snprintf(local_4a,10,"[%s]","IE");
      bVar5 = emulator_read_u8_raw(pEVar1,0xffff);
      ImGui::Text("0x%04X%8s:",0xffff,local_4a);
      ImGui::SameLine(0.0,-1.0);
      uVar6 = 0xf9;
      ImGui::TextColored(&kRegColor_1,"%02X ",(ulong)bVar5);
      args_3_02._4_4_ = kRegColor.y;
      args_3_02._0_4_ = kRegColor.x;
      args_2_02._4_1_ = buf[4];
      args_2_02._5_1_ = buf[5];
      args_2_02._6_1_ = buf[6];
      args_2_02._7_1_ = buf[7];
      args_2_02.mask = buf[0];
      args_2_02._1_1_ = buf[1];
      args_2_02._2_1_ = buf[2];
      args_2_02._3_1_ = buf[3];
      args_1_02._4_4_ = kRegColor_3.y;
      args_1_02._0_4_ = kRegColor_3.x;
      args_02._33_7_ = uStack_5b7;
      args_02.invert = (bool)local_5b8;
      args_02._1_7_ = uStack_5d7;
      args_02.mask = local_5d8;
      arg_00._33_7_ = uStack_58f;
      arg_00.invert = (bool)local_590;
      arg_00._1_7_ = uStack_5af;
      arg_00.mask = local_5b0;
      arg_00.true_text = pcStack_5a8;
      arg_00.false_text = local_5a0;
      arg_00.tooltip = (char *)uStack_598;
      args_02.true_text = pcStack_5d0;
      args_02.false_text = local_5c8;
      args_02.tooltip = (char *)uStack_5c0;
      args_1_02.true_text = (char *)kRegColor_3._8_8_;
      args_1_02.false_text = "";
      args_1_02.tooltip = (char *)0x0;
      args_1_02._32_8_ = (ulong)uStack_427 << 8;
      args_2_02.true_text = stack0xfffffffffffffb98;
      args_2_02.false_text = "";
      args_2_02.tooltip = (char *)0x0;
      args_2_02._32_8_ = (ulong)uStack_44f << 8;
      args_3_02.true_text = (char *)kRegColor._8_8_;
      args_3_02.false_text = "";
      args_3_02.tooltip = (char *)0x0;
      args_3_02._32_8_ = (ulong)uStack_5df << 8;
      (anonymous_namespace)::
      TextRegBits<(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg,(anonymous_namespace)::BitArg>
                ((Emulator *)(ulong)bVar5,uVar6,arg_00,args_02,args_1_02,args_2_02,args_3_02);
      pDVar2 = (this->super_Window).d;
      if (pDVar2->is_cgb == true) {
        ImGui::NewLine();
        local_480 = 0;
        local_478 = 2;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 0",(CgbSwatchArg)ZEXT812(0),
                   (CgbSwatchArg)(ZEXT412(1) << 0x40),(CgbSwatchArg)(ZEXT412(2) << 0x40),
                   (CgbSwatchArg)(ZEXT412(3) << 0x40));
        local_490 = 0x100000000;
        local_488 = 2;
        args_2_03.color_index = 2;
        args_2_03.type = CGB_PALETTE_TYPE_BGCP;
        args_2_03.palette_index = 1;
        args_3_03.color_index = 3;
        args_3_03.type = CGB_PALETTE_TYPE_BGCP;
        args_3_03.palette_index = 1;
        args_1_05.color_index = 1;
        args_1_05.type = CGB_PALETTE_TYPE_BGCP;
        args_1_05.palette_index = 1;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 1",(CgbSwatchArg)ZEXT812(0x100000000),
                   args_1_05,args_2_03,args_3_03);
        local_4a0 = 0x200000000;
        local_498 = 2;
        args_2_04.color_index = 2;
        args_2_04.type = CGB_PALETTE_TYPE_BGCP;
        args_2_04.palette_index = 2;
        args_3_04.color_index = 3;
        args_3_04.type = CGB_PALETTE_TYPE_BGCP;
        args_3_04.palette_index = 2;
        args_1_06.color_index = 1;
        args_1_06.type = CGB_PALETTE_TYPE_BGCP;
        args_1_06.palette_index = 2;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 2",(CgbSwatchArg)ZEXT812(0x200000000),
                   args_1_06,args_2_04,args_3_04);
        local_4b0 = 0x300000000;
        local_4a8 = 2;
        args_2_05.color_index = 2;
        args_2_05.type = CGB_PALETTE_TYPE_BGCP;
        args_2_05.palette_index = 3;
        args_3_05.color_index = 3;
        args_3_05.type = CGB_PALETTE_TYPE_BGCP;
        args_3_05.palette_index = 3;
        args_1_07.color_index = 1;
        args_1_07.type = CGB_PALETTE_TYPE_BGCP;
        args_1_07.palette_index = 3;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 3",(CgbSwatchArg)ZEXT812(0x300000000),
                   args_1_07,args_2_05,args_3_05);
        local_4c0 = 0x400000000;
        local_4b8 = 2;
        args_2_06.color_index = 2;
        args_2_06.type = CGB_PALETTE_TYPE_BGCP;
        args_2_06.palette_index = 4;
        args_3_06.color_index = 3;
        args_3_06.type = CGB_PALETTE_TYPE_BGCP;
        args_3_06.palette_index = 4;
        args_1_08.color_index = 1;
        args_1_08.type = CGB_PALETTE_TYPE_BGCP;
        args_1_08.palette_index = 4;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 4",(CgbSwatchArg)ZEXT812(0x400000000),
                   args_1_08,args_2_06,args_3_06);
        local_4d0 = 0x500000000;
        local_4c8 = 2;
        args_2_07.color_index = 2;
        args_2_07.type = CGB_PALETTE_TYPE_BGCP;
        args_2_07.palette_index = 5;
        args_3_07.color_index = 3;
        args_3_07.type = CGB_PALETTE_TYPE_BGCP;
        args_3_07.palette_index = 5;
        args_1_09.color_index = 1;
        args_1_09.type = CGB_PALETTE_TYPE_BGCP;
        args_1_09.palette_index = 5;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 5",(CgbSwatchArg)ZEXT812(0x500000000),
                   args_1_09,args_2_07,args_3_07);
        local_4e0 = 0x600000000;
        local_4d8 = 2;
        args_2_08.color_index = 2;
        args_2_08.type = CGB_PALETTE_TYPE_BGCP;
        args_2_08.palette_index = 6;
        args_3_08.color_index = 3;
        args_3_08.type = CGB_PALETTE_TYPE_BGCP;
        args_3_08.palette_index = 6;
        args_1_10.color_index = 1;
        args_1_10.type = CGB_PALETTE_TYPE_BGCP;
        args_1_10.palette_index = 6;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 6",(CgbSwatchArg)ZEXT812(0x600000000),
                   args_1_10,args_2_08,args_3_08);
        local_4f0 = 0x700000000;
        local_4e8 = 2;
        args_2_09.color_index = 2;
        args_2_09.type = CGB_PALETTE_TYPE_BGCP;
        args_2_09.palette_index = 7;
        args_3_09.color_index = 3;
        args_3_09.type = CGB_PALETTE_TYPE_BGCP;
        args_3_09.palette_index = 7;
        args_1_11.color_index = 1;
        args_1_11.type = CGB_PALETTE_TYPE_BGCP;
        args_1_11.palette_index = 7;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB BG Pal 7",(CgbSwatchArg)ZEXT812(0x700000000),
                   args_1_11,args_2_09,args_3_09);
        local_500 = 1;
        local_4f8 = 2;
        args_2_10.color_index = 2;
        args_2_10.type = CGB_PALETTE_TYPE_OBCP;
        args_2_10.palette_index = 0;
        args_3_10.color_index = 3;
        args_3_10.type = CGB_PALETTE_TYPE_OBCP;
        args_3_10.palette_index = 0;
        args_1_12.color_index = 1;
        args_1_12.type = CGB_PALETTE_TYPE_OBCP;
        args_1_12.palette_index = 0;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 0",(CgbSwatchArg)ZEXT812(1),args_1_12,
                   args_2_10,args_3_10);
        local_510 = local_588;
        local_508 = 2;
        args_2_11.color_index = 2;
        args_2_11.type = local_588.palette_index;
        args_2_11.palette_index = local_588.color_index;
        args_3_11.color_index = 3;
        args_3_11.type = local_588.palette_index;
        args_3_11.palette_index = local_588.color_index;
        args_10.color_index = 0;
        args_10.type = local_588.palette_index;
        args_10.palette_index = local_588.color_index;
        args_1_13.color_index = 1;
        args_1_13.type = local_588.palette_index;
        args_1_13.palette_index = local_588.color_index;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 1",args_10,args_1_13,args_2_11,args_3_11
                  );
        local_520 = local_580;
        local_518 = 2;
        args_2_12.color_index = 2;
        args_2_12.type = local_580.palette_index;
        args_2_12.palette_index = local_580.color_index;
        args_3_12.color_index = 3;
        args_3_12.type = local_580.palette_index;
        args_3_12.palette_index = local_580.color_index;
        args_11.color_index = 0;
        args_11.type = local_580.palette_index;
        args_11.palette_index = local_580.color_index;
        args_1_14.color_index = 1;
        args_1_14.type = local_580.palette_index;
        args_1_14.palette_index = local_580.color_index;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 2",args_11,args_1_14,args_2_12,args_3_12
                  );
        local_530 = local_578;
        local_528 = 2;
        args_2_13.color_index = 2;
        args_2_13.type = local_578.palette_index;
        args_2_13.palette_index = local_578.color_index;
        args_3_13.color_index = 3;
        args_3_13.type = local_578.palette_index;
        args_3_13.palette_index = local_578.color_index;
        args_12.color_index = 0;
        args_12.type = local_578.palette_index;
        args_12.palette_index = local_578.color_index;
        args_1_15.color_index = 1;
        args_1_15.type = local_578.palette_index;
        args_1_15.palette_index = local_578.color_index;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 3",args_12,args_1_15,args_2_13,args_3_13
                  );
        local_540 = 0x400000001;
        local_538 = 2;
        args_2_14.color_index = 2;
        args_2_14.type = CGB_PALETTE_TYPE_OBCP;
        args_2_14.palette_index = 4;
        args_3_14.color_index = 3;
        args_3_14.type = CGB_PALETTE_TYPE_OBCP;
        args_3_14.palette_index = 4;
        args_1_16.color_index = 1;
        args_1_16.type = CGB_PALETTE_TYPE_OBCP;
        args_1_16.palette_index = 4;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 4",(CgbSwatchArg)ZEXT812(0x400000001),
                   args_1_16,args_2_14,args_3_14);
        local_550 = 0x500000001;
        local_548 = 2;
        args_2_15.color_index = 2;
        args_2_15.type = CGB_PALETTE_TYPE_OBCP;
        args_2_15.palette_index = 5;
        args_3_15.color_index = 3;
        args_3_15.type = CGB_PALETTE_TYPE_OBCP;
        args_3_15.palette_index = 5;
        args_1_17.color_index = 1;
        args_1_17.type = CGB_PALETTE_TYPE_OBCP;
        args_1_17.palette_index = 5;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 5",(CgbSwatchArg)ZEXT812(0x500000001),
                   args_1_17,args_2_15,args_3_15);
        local_560 = 0x600000001;
        local_558 = 2;
        args_2_16.color_index = 2;
        args_2_16.type = CGB_PALETTE_TYPE_OBCP;
        args_2_16.palette_index = 6;
        args_3_16.color_index = 3;
        args_3_16.type = CGB_PALETTE_TYPE_OBCP;
        args_3_16.palette_index = 6;
        args_1_18.color_index = 1;
        args_1_18.type = CGB_PALETTE_TYPE_OBCP;
        args_1_18.palette_index = 6;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 6",(CgbSwatchArg)ZEXT812(0x600000001),
                   args_1_18,args_2_16,args_3_16);
        local_570 = 0x700000001;
        local_568 = 2;
        args_2_17.color_index = 2;
        args_2_17.type = CGB_PALETTE_TYPE_OBCP;
        args_2_17.palette_index = 7;
        args_3_17.color_index = 3;
        args_3_17.type = CGB_PALETTE_TYPE_OBCP;
        args_3_17.palette_index = 7;
        args_1_19.color_index = 1;
        args_1_19.type = CGB_PALETTE_TYPE_OBCP;
        args_1_19.palette_index = 7;
        (anonymous_namespace)::
        TextCgbPal<(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg,(anonymous_namespace)::CgbSwatchArg>
                  (((this->super_Window).d)->e,"CGB OBJ Pal 7",(CgbSwatchArg)ZEXT812(0x700000001),
                   args_1_19,args_2_17,args_3_17);
      }
      else if (pDVar2->is_sgb == true) {
        ImGui::NewLine();
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 0",(SgbSwatchArg)0x0,
                   (SgbSwatchArg)0x100000000,(SgbSwatchArg)0x200000000,(SgbSwatchArg)0x300000000);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 1",(SgbSwatchArg)0x1,local_588,local_580,
                   local_578);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 2",(SgbSwatchArg)0x2,
                   (SgbSwatchArg)0x100000002,(SgbSwatchArg)0x200000002,(SgbSwatchArg)0x300000002);
        (anonymous_namespace)::
        TextSgbPal<(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg,(anonymous_namespace)::SgbSwatchArg>
                  (((this->super_Window).d)->e,"SGB Pal 3",(SgbSwatchArg)0x3,
                   (SgbSwatchArg)0x100000003,(SgbSwatchArg)0x200000003,(SgbSwatchArg)0x300000003);
      }
    }
    ImGui::End();
  }
  return;
}

Assistant:

void Debugger::IOWindow::Tick() {
  if (!is_open) return;

  if (ImGui::Begin(Debugger::s_io_window_name, &is_open)) {
    u8 v;
    TextReg(d->e, 0xff00, "JOYP", InvBit(0x18, "D"), InvBit(0x14, "U"),
            InvBit(0x12, "L"), InvBit(0x11, "R"), InvBit(0x28, "+"),
            InvBit(0x24, "-"), InvBit(0x22, "B"), InvBit(0x21, "A"));

    TextReg(d->e, 0xff01, "SB");
    TextReg(d->e, 0xff02, "SC");
    TextReg(d->e, 0xff04, "DIV");
    TextReg(d->e, 0xff05, "TIMA");
    TextReg(d->e, 0xff06, "TMA");
    TextReg(d->e, 0xff07, "TAC", Bit(0x4, "on", "off"), Enum<TimerClock>(0x3));

    TextReg(d->e, 0xff0f, "IF", Bit0(0x10, "JOYP "), Bit0(0x8, "SERIAL "),
            Bit0(0x4, "TIMER "), Bit0(0x2, "STAT "), Bit0(0x1, "VBLANK "));

    TextReg(d->e, 0xff40, "LCDC", Bit2(0x80, "D ", "Display"),
            Bit2(0x40, "WM", "Window tile map select"),
            Bit2(0x20, "Wd", "Window display"),
            Bit2(0x10, "BD", "BG tile data select"),
            Bit2(0x08, "BM", "BG tile map select"),
            Bit2(0x04, "Os", "Obj size"), Bit2(0x02, "Od", "Obj display"),
            Bit2(0x01, "Bd", "BG display"));

    TextReg(d->e, 0xff41, "STAT", Bit2(0x40, "Yi", "Y compare interrupt"),
            Bit2(0x20, "2i", "Mode 2 interrupt"),
            Bit2(0x10, "Vi", "Vblank interrupt"),
            Bit2(0x08, "Hi", "Hblank interrupt"),
            Bit2(0x04, "Y=", "Y compare set"), Int("Mode", 0x03));

    TextReg(d->e, 0xff42, "SCY");
    TextReg(d->e, 0xff43, "SCX");
    TextReg(d->e, 0xff44, "LY");
    TextReg(d->e, 0xff45, "LYC");
    TextReg(d->e, 0xff47, "BGP", Swatch(PALETTE_TYPE_BGP, 0),
            Swatch(PALETTE_TYPE_BGP, 1), Swatch(PALETTE_TYPE_BGP, 2),
            Swatch(PALETTE_TYPE_BGP, 3));
    TextReg(d->e, 0xff48, "OPB0", Swatch(PALETTE_TYPE_OBP0, 0),
            Swatch(PALETTE_TYPE_OBP0, 1), Swatch(PALETTE_TYPE_OBP0, 2),
            Swatch(PALETTE_TYPE_OBP0, 3));
    TextReg(d->e, 0xff49, "OPB1", Swatch(PALETTE_TYPE_OBP1, 0),
            Swatch(PALETTE_TYPE_OBP1, 1), Swatch(PALETTE_TYPE_OBP1, 2),
            Swatch(PALETTE_TYPE_OBP1, 3));
    TextReg(d->e, 0xff4A, "WY");
    TextReg(d->e, 0xff4B, "WX");

    if (d->is_cgb) {
      TextReg(d->e, 0xff4d, "KEY1", Bit1(0x80, "Sp", "Current speed"),
              Bit1(0x1, "Sw", "Speed switch"));
      TextReg(d->e, 0xff4f, "VBK", Int("Bank", 0x1));
      TextReg(d->e, 0xff55, "HDMA5", Int("Mode", 0x80, 7), Int("Blocks", 0x7f));
      TextReg(d->e, 0xff56, "RP", Int("Enable", 0xc0, 6),
              Bit1(0x2, "R", "Read"), Bit1(0x01, "W", "Write"));

      TextReg(d->e, 0xff68, "BCPS", Bit1(0x80, "+", "Auto-increment"),
              Int("Index", 0x3f));
      TextReg(d->e, 0xff69, "BCPD");
      TextReg(d->e, 0xff6a, "OCPS", Bit1(0x80, "+", "Auto-increment"),
              Int("Index", 0x3f));
      TextReg(d->e, 0xff6b, "OCPD");
      TextReg(d->e, 0xff70, "SVBK", Int("Bank", 0x7));
    }

    TextReg(d->e, 0xffff, "IE", Bit0(0x10, "JOYP "), Bit0(0x8, "SERIAL "),
            Bit0(0x4, "TIMER "), Bit0(0x2, "STAT "), Bit0(0x1, "VBLANK "));

    if (d->is_cgb) {
      ImGui::NewLine();
      TextCgbPal(d->e, "CGB BG Pal 0", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 0, 3));
      TextCgbPal(d->e, "CGB BG Pal 1", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 1, 3));
      TextCgbPal(d->e, "CGB BG Pal 2", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 2, 3));
      TextCgbPal(d->e, "CGB BG Pal 3", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 3, 3));
      TextCgbPal(d->e, "CGB BG Pal 4", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 4, 3));
      TextCgbPal(d->e, "CGB BG Pal 5", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 5, 3));
      TextCgbPal(d->e, "CGB BG Pal 6", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 6, 3));
      TextCgbPal(d->e, "CGB BG Pal 7", CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_BGCP, 7, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 0", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 0, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 1", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 1, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 2", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 2, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 3", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 3, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 4", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 4, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 5", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 5, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 6", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 6, 3));
      TextCgbPal(d->e, "CGB OBJ Pal 7", CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 0),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 1),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 2),
                 CgbSwatch(CGB_PALETTE_TYPE_OBCP, 7, 3));
    } else if (d->is_sgb) {
      ImGui::NewLine();
      TextSgbPal(d->e, "SGB Pal 0", SgbSwatch(0, 0), SgbSwatch(0, 1),
                 SgbSwatch(0, 2), SgbSwatch(0, 3));
      TextSgbPal(d->e, "SGB Pal 1", SgbSwatch(1, 0), SgbSwatch(1, 1),
                 SgbSwatch(1, 2), SgbSwatch(1, 3));
      TextSgbPal(d->e, "SGB Pal 2", SgbSwatch(2, 0), SgbSwatch(2, 1),
                 SgbSwatch(2, 2), SgbSwatch(2, 3));
      TextSgbPal(d->e, "SGB Pal 3", SgbSwatch(3, 0), SgbSwatch(3, 1),
                 SgbSwatch(3, 2), SgbSwatch(3, 3));
    }
  }
  ImGui::End();
}